

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O1

void Cmd_idclev(FCommandLine *argv,APlayerPawn *who,int key)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  FString mapname;
  FString local_28;
  FString local_20;
  
  if ((((!netgame) && (iVar3 = FCommandLine::argc(argv), 1 < iVar3)) &&
      (pcVar4 = FCommandLine::operator[](argv,1), pcVar4[2] == '\0')) &&
     ((pcVar4 = FCommandLine::operator[](argv,1), pcVar4[1] != '\0' &&
      (pcVar4 = FCommandLine::operator[](argv,1), *pcVar4 != '\0')))) {
    local_28.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    pcVar4 = FCommandLine::operator[](argv,1);
    cVar1 = *pcVar4;
    FCommandLine::operator[](argv,1);
    iVar3 = 1;
    if (((byte)gameinfo.flags & 1) == 0) {
      iVar3 = (int)(char)(cVar1 + -0x30);
    }
    CalcMapName((int)&local_20,iVar3);
    FString::operator=(&local_28,&local_20);
    FString::~FString(&local_20);
    bVar2 = P_CheckMapData(local_28.Chars);
    if (bVar2) {
      pcVar4 = FStringTable::operator()(&GStrings,"STSTR_CLEV");
      Printf("%s\n",pcVar4);
      G_DeferedInitNew(local_28.Chars,-1);
    }
    FString::~FString(&local_28);
  }
  return;
}

Assistant:

CCMD (idclev)
{
	if (netgame)
		return;

	if ((argv.argc() > 1) && (*(argv[1] + 2) == 0) && *(argv[1] + 1) && *argv[1])
	{
		int epsd, map;
		char buf[2];
		FString mapname;

		buf[0] = argv[1][0] - '0';
		buf[1] = argv[1][1] - '0';

		if (gameinfo.flags & GI_MAPxx)
		{
			epsd = 1;
			map = buf[0]*10 + buf[1];
		}
		else
		{
			epsd = buf[0];
			map = buf[1];
		}

		// Catch invalid maps.
		mapname = CalcMapName (epsd, map);

		if (!P_CheckMapData(mapname))
			return;

		// So be it.
		Printf ("%s\n", GStrings("STSTR_CLEV"));
      	G_DeferedInitNew (mapname);
		//players[0].health = 0;		// Force reset
	}
}